

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O0

void __thiscall iu_AssertionTest_x_iutest_x_LE_Test::Body(iu_AssertionTest_x_iutest_x_LE_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double *in_R9;
  AssertionHelper local_7d8;
  Fixed local_7a8;
  undefined1 local_620 [8];
  AssertionResult iutest_ar_3;
  Fixed local_5c8;
  undefined4 local_43c;
  char local_438 [8];
  undefined1 local_430 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3d8;
  undefined1 local_250 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_220;
  Fixed local_1f0;
  undefined1 local_58 [8];
  AssertionResult iutest_ar;
  double d1;
  double d0;
  float f1;
  float f0;
  int y0;
  int x0;
  iu_AssertionTest_x_iutest_x_LE_Test *this_local;
  
  f0 = 0.0;
  f1 = 0.0;
  d0._4_4_ = 0;
  d0._0_4_ = 0x3f800000;
  d1 = 0.0;
  iutest_ar.m_result = false;
  iutest_ar._33_7_ = 0x3ff00000000000;
  _y0 = this;
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperLE<int,int>
            ((AssertionResult *)local_58,(internal *)"x0","y0",(char *)&f0,(int *)&f1,(int *)in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    memset(&local_1f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1f0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_58);
    iutest::AssertionHelper::AssertionHelper
              (&local_220,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
               ,0x9e,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_220,&local_1f0);
    iutest::AssertionHelper::~AssertionHelper(&local_220);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1f0);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperLE<float,float>
              ((AssertionResult *)local_250,(internal *)0x544bb2,"f1",(char *)((long)&d0 + 4),
               (float *)&d0,(float *)in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
    if (!bVar1) {
      memset(&local_3d8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3d8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_250);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_2.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0x9f,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3d8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3d8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_250);
    iutest::detail::AlwaysZero();
    local_438[0] = '\0';
    local_438[1] = '\0';
    local_438[2] = '\0';
    local_438[3] = '\0';
    local_438[4] = '\0';
    local_438[5] = '\0';
    local_438[6] = '\0';
    local_438[7] = '\0';
    local_43c = 1;
    iutest::internal::CmpHelperLE<double,int>
              ((AssertionResult *)local_430,(internal *)"0.0","0x1",local_438,(double *)&local_43c,
               (int *)in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
    if (!bVar1) {
      memset(&local_5c8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5c8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_430);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_3.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0xa0,pcVar2,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_5c8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5c8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_430);
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperLE<double,double>
              ((AssertionResult *)local_620,(internal *)"d0","d1",(char *)&d1,
               (double *)&iutest_ar.m_result,in_R9);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
    if (!bVar1) {
      memset(&local_7a8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_7a8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_620);
      iutest::AssertionHelper::AssertionHelper
                (&local_7d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0xa1,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_7d8,&local_7a8);
      iutest::AssertionHelper::~AssertionHelper(&local_7d8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_7a8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  }
  return;
}

Assistant:

IUTEST(AssertionTest, LE)
{
    int x0=0, y0=0;
    float f0=0.0f, f1=1.0f;
    double d0=0.0, d1=1.0;
    IUTEST_ASSERT_LE(x0, y0);
    IUTEST_EXPECT_LE(f0, f1);
    IUTEST_INFORM_LE(0.0, 0x1);
    IUTEST_EXPECT_LE(d0, d1);
}